

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O3

double __thiscall LSL_STD<UF>::Alloc(LSL_STD<UF> *this)

{
  size_t __n;
  int iVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  int *piVar8;
  ulong cols;
  ulong uVar9;
  size_t rows;
  size_t __n_00;
  size_t __n_01;
  size_t cols_00;
  size_t __n_02;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Mat local_90 [96];
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar2->field_0x8;
  iVar10 = *(int *)&pMVar2->field_0xc;
  dVar4 = UF::Alloc(((iVar10 - (iVar10 + 1 >> 0x1f)) + 1 >> 1) *
                    ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) + 1,
                    &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  piVar8 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar8,piVar8[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar2->field_0x8;
  rows = (size_t)iVar1;
  cols_00 = (size_t)*(int *)&pMVar2->field_0xc;
  Table2D::Reserve(&this->ER,rows,cols_00);
  cols = cols_00 + 1 & 0xfffffffffffffffe;
  Table2D::Reserve(&this->RLC,rows + 1,cols);
  __n = rows * 4;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)rows) {
    uVar9 = __n;
  }
  piVar8 = (int *)operator_new__(uVar9);
  this->ner = piVar8;
  iVar10 = (int)(cols_00 + 1);
  Table2D::Reserve(&this->ERA,rows,(long)iVar10);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  __n_02 = cols_00 * rows * 4;
  memset(*(this->ER).prows,0,__n_02);
  __n_01 = (long)((int)cols * (int)(rows + 1)) << 2;
  memset(*(this->RLC).prows,0,__n_01);
  memset(this->ner,0,__n);
  __n_00 = (long)(iVar10 * iVar1) << 2;
  memset(*(this->ERA).prows,0,__n_00);
  lVar7 = cv::getTickCount();
  dVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar11 = (double)lVar7 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar11;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar11;
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  memset(*(this->ER).prows,0,__n_02);
  memset(*(this->RLC).prows,0,__n_01);
  memset(this->ner,0,__n);
  memset(*(this->ERA).prows,0,__n_00);
  lVar7 = cv::getTickCount();
  dVar5 = (double)lVar7 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar5;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar5 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  auVar12._0_8_ = dVar11 * 1000.0;
  auVar12._8_8_ = dVar5 * 1000.0;
  dVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar13._8_4_ = SUB84(dVar5,0);
  auVar13._0_8_ = dVar6;
  auVar13._12_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar13 = divpd(auVar12,auVar13);
  return dVar4 + (auVar13._0_8_ - auVar13._8_8_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image and for other structures
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());

        int rows = img_.rows;
        int cols = img_.cols;

        ER.Reserve(rows, cols); // Matrix of relative label (1 label/pixel)

        // Notes on the RLC table:
        // 1) rows: +1 in order to handle compact usage of RLC table without if statements,
        // 2) columns: MISSING in the paper, RLC requires 2 values/run in row, so width must be next multiple of 2.
        RLC.Reserve(rows + 1, (cols + 1) & ~1);

        ner = new int[rows]; //vector<int> ner(rows); // Number of runs 

        ERA.Reserve(rows, cols + 1); // MISSING in the paper: ERA must have one column more than the input image 
        // in order to handle special cases (e.g. lines with chessboard pattern 
        // starting with a foreground pixel) 

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(*ER.prows, 0, rows*cols * sizeof(unsigned));
        memset(*RLC.prows, 0, (rows + 1)*((cols + 1) & ~1) * sizeof(unsigned));
        memset(ner, 0, rows*sizeof(int));
        memset(*ERA.prows, 0, rows*(cols + 1) * sizeof(unsigned));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }